

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carLot.cpp
# Opt level: O2

void PrintInventory(vector<Car,_std::allocator<Car>_> *cars)

{
  double dVar1;
  pointer pCVar2;
  pointer pCVar3;
  long lVar4;
  ostream *poVar5;
  reference pvVar6;
  int i;
  ulong __n;
  
  pCVar2 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pCVar3 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  if (pCVar2 != pCVar3) {
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)&std::cout,"Inventory printout:");
    __n = 0;
    while( true ) {
      poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar5);
      if ((ulong)(((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                        super__Vector_impl_data._M_start) / 0x78) <= __n) break;
      poVar5 = std::operator<<((ostream *)&std::cout,"Car ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)__n + 1);
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Make: ");
      pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
      poVar5 = std::operator<<(poVar5,(string *)pvVar6);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Model: ");
      pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
      poVar5 = std::operator<<(poVar5,(string *)&pvVar6->model);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Year: ");
      pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar6->year);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Purchase price: $");
      lVar4 = *(long *)poVar5;
      *(undefined8 *)(poVar5 + *(long *)(lVar4 + -0x18) + 8) = 2;
      lVar4 = *(long *)(lVar4 + -0x18);
      *(uint *)(poVar5 + lVar4 + 0x18) = *(uint *)(poVar5 + lVar4 + 0x18) & 0xfffffefb | 4;
      pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
      poVar5 = std::ostream::_M_insert<double>(pvVar6->purchasePrice);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Date purchased: ");
      pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar6->datePurchased).month);
      poVar5 = std::operator<<(poVar5,"/");
      pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar6->datePurchased).day);
      poVar5 = std::operator<<(poVar5,"/");
      pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar6->datePurchased).year);
      std::endl<char,std::char_traits<char>>(poVar5);
      pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
      if (pvVar6->isSold == true) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Status: SOLD");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"Sale Price: $");
        lVar4 = *(long *)poVar5;
        *(undefined8 *)(poVar5 + *(long *)(lVar4 + -0x18) + 8) = 2;
        lVar4 = *(long *)(lVar4 + -0x18);
        *(uint *)(poVar5 + lVar4 + 0x18) = *(uint *)(poVar5 + lVar4 + 0x18) & 0xfffffefb | 4;
        pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
        poVar5 = std::ostream::_M_insert<double>(pvVar6->salePrice);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"Date sold: ");
        pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar6->dateSold).month);
        poVar5 = std::operator<<(poVar5,"/");
        pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar6->dateSold).day);
        poVar5 = std::operator<<(poVar5,"/");
        pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar6->dateSold).year);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"Profit: $");
        lVar4 = *(long *)poVar5;
        *(undefined8 *)(poVar5 + *(long *)(lVar4 + -0x18) + 8) = 2;
        lVar4 = *(long *)(lVar4 + -0x18);
        *(uint *)(poVar5 + lVar4 + 0x18) = *(uint *)(poVar5 + lVar4 + 0x18) & 0xfffffefb | 4;
        pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
        dVar1 = pvVar6->salePrice;
        pvVar6 = std::vector<Car,_std::allocator<Car>_>::at(cars,__n);
        poVar5 = std::ostream::_M_insert<double>(dVar1 - pvVar6->purchasePrice);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"Status: NOT SOLD");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"Sale price: N/A");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"Sale date: N/A");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"Profit: N/A");
      }
      std::endl<char,std::char_traits<char>>(poVar5);
      __n = __n + 1;
    }
    return;
  }
  poVar5 = std::operator<<(poVar5,"No cars in inventory!");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void PrintInventory(vector<Car> &cars)
{

    if(cars.size() == 0)
    {
        cout << endl << "No cars in inventory!" << endl << endl;
        return;
    }

    cout << endl << endl;
    cout << "Inventory printout:";
    cout << endl << endl;

    for(int i = 0; i < cars.size(); i++)
    {
        cout << "Car " << (i + 1) << endl << endl;
        cout << "Make: " << cars.at(i).make << endl;
        cout << "Model: " << cars.at(i).model << endl;
        cout << "Year: " << cars.at(i).year << endl;
        cout << "Purchase price: $" << setprecision(2) << fixed << cars.at(i).purchasePrice << endl;
        cout << "Date purchased: " << cars.at(i).datePurchased.month << "/" << cars.at(i).datePurchased.day <<
                "/" << cars.at(i).datePurchased.year << endl;
        if(cars.at(i).isSold)
        {
            cout << "Status: SOLD" << endl;
            cout << "Sale Price: $" << setprecision(2) << fixed << cars.at(i).salePrice << endl;
            cout << "Date sold: " << cars.at(i).dateSold.month << "/" << cars.at(i).dateSold.day <<
                    "/" << cars.at(i).dateSold.year << endl;
            cout << "Profit: $" << setprecision(2) << fixed << (cars.at(i).salePrice - cars.at(i).purchasePrice) << endl;

        }
        else
        {
            cout << "Status: NOT SOLD" << endl;
            cout << "Sale price: N/A" << endl;
            cout << "Sale date: N/A" << endl;
            cout << "Profit: N/A" << endl;
        }

        cout << endl << endl;
    }
}